

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::ValueType::MergeFrom(ValueType *this,ValueType *from)

{
  TypeCase TVar1;
  LogMessage *other;
  TensorType *this_00;
  TensorType *from_00;
  ListType *this_01;
  ListType *from_01;
  TupleType *this_02;
  TupleType *from_02;
  DictionaryType *this_03;
  DictionaryType *from_03;
  StateType *this_04;
  StateType *from_04;
  LogFinisher local_65;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  ValueType *local_18;
  ValueType *from_local;
  ValueType *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/MIL.pb.cc"
               ,0xcd8);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_65,other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  TVar1 = type_case(local_18);
  switch(TVar1) {
  case TYPE_NOT_SET:
    break;
  case kTensorType:
    this_00 = _internal_mutable_tensortype(this);
    from_00 = _internal_tensortype(local_18);
    TensorType::MergeFrom(this_00,from_00);
    break;
  case kListType:
    this_01 = _internal_mutable_listtype(this);
    from_01 = _internal_listtype(local_18);
    ListType::MergeFrom(this_01,from_01);
    break;
  case kTupleType:
    this_02 = _internal_mutable_tupletype(this);
    from_02 = _internal_tupletype(local_18);
    TupleType::MergeFrom(this_02,from_02);
    break;
  case kDictionaryType:
    this_03 = _internal_mutable_dictionarytype(this);
    from_03 = _internal_dictionarytype(local_18);
    DictionaryType::MergeFrom(this_03,from_03);
    break;
  case kStateType:
    this_04 = _internal_mutable_statetype(this);
    from_04 = _internal_statetype(local_18);
    StateType::MergeFrom(this_04,from_04);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void ValueType::MergeFrom(const ValueType& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.MILSpec.ValueType)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.type_case()) {
    case kTensorType: {
      _internal_mutable_tensortype()->::CoreML::Specification::MILSpec::TensorType::MergeFrom(from._internal_tensortype());
      break;
    }
    case kListType: {
      _internal_mutable_listtype()->::CoreML::Specification::MILSpec::ListType::MergeFrom(from._internal_listtype());
      break;
    }
    case kTupleType: {
      _internal_mutable_tupletype()->::CoreML::Specification::MILSpec::TupleType::MergeFrom(from._internal_tupletype());
      break;
    }
    case kDictionaryType: {
      _internal_mutable_dictionarytype()->::CoreML::Specification::MILSpec::DictionaryType::MergeFrom(from._internal_dictionarytype());
      break;
    }
    case kStateType: {
      _internal_mutable_statetype()->::CoreML::Specification::MILSpec::StateType::MergeFrom(from._internal_statetype());
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}